

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O2

void __thiscall spv::Function::addBlock(Function *this,Block *block)

{
  Block *local_8;
  
  local_8 = block;
  std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>::push_back(&this->blocks,&local_8);
  return;
}

Assistant:

void addBlock(Block* block) { blocks.push_back(block); }